

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

uv_handle_type uv_guess_handle(uv_file file)

{
  int iVar1;
  uv_handle_type uVar2;
  int local_b8 [2];
  int type;
  socklen_t len;
  stat s;
  sockaddr sa;
  uv_file file_local;
  
  if (file < 0) {
    sa.sa_data[10] = '\0';
    sa.sa_data[0xb] = '\0';
    sa.sa_data[0xc] = '\0';
    sa.sa_data[0xd] = '\0';
  }
  else {
    iVar1 = isatty(file);
    if (iVar1 == 0) {
      iVar1 = fstat(file,(stat *)&type);
      if (iVar1 == 0) {
        if (((uint)s.st_nlink & 0xf000) == 0x8000) {
          sa.sa_data[10] = '\x11';
          sa.sa_data[0xb] = '\0';
          sa.sa_data[0xc] = '\0';
          sa.sa_data[0xd] = '\0';
        }
        else if (((uint)s.st_nlink & 0xf000) == 0x2000) {
          sa.sa_data[10] = '\x11';
          sa.sa_data[0xb] = '\0';
          sa.sa_data[0xc] = '\0';
          sa.sa_data[0xd] = '\0';
        }
        else if (((uint)s.st_nlink & 0xf000) == 0x1000) {
          sa.sa_data[10] = '\a';
          sa.sa_data[0xb] = '\0';
          sa.sa_data[0xc] = '\0';
          sa.sa_data[0xd] = '\0';
        }
        else if (((uint)s.st_nlink & 0xf000) == 0xc000) {
          local_b8[1] = 4;
          iVar1 = getsockopt(file,1,3,local_b8,(socklen_t *)(local_b8 + 1));
          if (iVar1 == 0) {
            local_b8[1] = 0x10;
            iVar1 = getsockname(file,(sockaddr *)(s.__glibc_reserved + 2),
                                (socklen_t *)(local_b8 + 1));
            if (iVar1 == 0) {
              if ((local_b8[0] == 2) &&
                 (((short)s.__glibc_reserved[2] == 2 || ((short)s.__glibc_reserved[2] == 10)))) {
                sa.sa_data[10] = '\x0f';
                sa.sa_data[0xb] = '\0';
                sa.sa_data[0xc] = '\0';
                sa.sa_data[0xd] = '\0';
              }
              else {
                if (local_b8[0] == 1) {
                  if (((short)s.__glibc_reserved[2] == 2) || ((short)s.__glibc_reserved[2] == 10)) {
                    return UV_TCP;
                  }
                  if ((short)s.__glibc_reserved[2] == 1) {
                    return UV_NAMED_PIPE;
                  }
                }
                sa.sa_data[10] = '\0';
                sa.sa_data[0xb] = '\0';
                sa.sa_data[0xc] = '\0';
                sa.sa_data[0xd] = '\0';
              }
            }
            else {
              sa.sa_data[10] = '\0';
              sa.sa_data[0xb] = '\0';
              sa.sa_data[0xc] = '\0';
              sa.sa_data[0xd] = '\0';
            }
          }
          else {
            sa.sa_data[10] = '\0';
            sa.sa_data[0xb] = '\0';
            sa.sa_data[0xc] = '\0';
            sa.sa_data[0xd] = '\0';
          }
        }
        else {
          sa.sa_data[10] = '\0';
          sa.sa_data[0xb] = '\0';
          sa.sa_data[0xc] = '\0';
          sa.sa_data[0xd] = '\0';
        }
      }
      else {
        sa.sa_data[10] = '\0';
        sa.sa_data[0xb] = '\0';
        sa.sa_data[0xc] = '\0';
        sa.sa_data[0xd] = '\0';
      }
    }
    else {
      sa.sa_data[10] = '\x0e';
      sa.sa_data[0xb] = '\0';
      sa.sa_data[0xc] = '\0';
      sa.sa_data[0xd] = '\0';
    }
  }
  uVar2._0_1_ = sa.sa_data[10];
  uVar2._1_1_ = sa.sa_data[0xb];
  uVar2._2_1_ = sa.sa_data[0xc];
  uVar2._3_1_ = sa.sa_data[0xd];
  return uVar2;
}

Assistant:

uv_handle_type uv_guess_handle(uv_file file) {
  struct sockaddr sa;
  struct stat s;
  socklen_t len;
  int type;

  if (file < 0)
    return UV_UNKNOWN_HANDLE;

  if (isatty(file))
    return UV_TTY;

  if (fstat(file, &s))
    return UV_UNKNOWN_HANDLE;

  if (S_ISREG(s.st_mode))
    return UV_FILE;

  if (S_ISCHR(s.st_mode))
    return UV_FILE;  /* XXX UV_NAMED_PIPE? */

  if (S_ISFIFO(s.st_mode))
    return UV_NAMED_PIPE;

  if (!S_ISSOCK(s.st_mode))
    return UV_UNKNOWN_HANDLE;

  len = sizeof(type);
  if (getsockopt(file, SOL_SOCKET, SO_TYPE, &type, &len))
    return UV_UNKNOWN_HANDLE;

  len = sizeof(sa);
  if (getsockname(file, &sa, &len))
    return UV_UNKNOWN_HANDLE;

  if (type == SOCK_DGRAM)
    if (sa.sa_family == AF_INET || sa.sa_family == AF_INET6)
      return UV_UDP;

  if (type == SOCK_STREAM) {
#if defined(_AIX) || defined(__DragonFly__)
    /* on AIX/DragonFly the getsockname call returns an empty sa structure
     * for sockets of type AF_UNIX.  For all other types it will
     * return a properly filled in structure.
     */
    if (len == 0)
      return UV_NAMED_PIPE;
#endif /* defined(_AIX) || defined(__DragonFly__) */

    if (sa.sa_family == AF_INET || sa.sa_family == AF_INET6)
      return UV_TCP;
    if (sa.sa_family == AF_UNIX)
      return UV_NAMED_PIPE;
  }

  return UV_UNKNOWN_HANDLE;
}